

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::Version::ForEachOverlapping
          (Version *this,Slice user_key,Slice internal_key,void *arg,
          _func_bool_void_ptr_int_FileMetaData_ptr *func)

{
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  reference ppFVar6;
  Slice local_d0;
  value_type local_c0;
  FileMetaData *f_1;
  size_type sStack_b0;
  uint32_t index;
  size_t num_files;
  undefined4 local_a0;
  int level;
  iterator iStack_98;
  uint32_t i_1;
  __normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_90;
  Slice local_88;
  Slice local_78;
  value_type local_68;
  FileMetaData *f;
  undefined1 local_58 [4];
  uint32_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> tmp;
  Comparator *ucmp;
  void *arg_local;
  Version *this_local;
  Slice internal_key_local;
  Slice user_key_local;
  
  internal_key_local.data_ = (char *)internal_key.size_;
  this_local = (Version *)internal_key.data_;
  internal_key_local.size_ = (size_t)user_key.data_;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)InternalKeyComparator::user_comparator(&this->vset_->icmp_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_58);
  sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->files_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_58,
             sVar4);
  for (f._4_4_ = 0; uVar5 = (ulong)f._4_4_,
      sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        (this->files_), uVar5 < sVar4; f._4_4_ = f._4_4_ + 1) {
    ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[](this->files_,(ulong)f._4_4_);
    ppFVar1 = tmp.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68 = *ppFVar6;
    local_78 = InternalKey::user_key(&local_68->smallest);
    iVar3 = (*(code *)(*ppFVar1)->file_size)(ppFVar1,&internal_key_local.size_,&local_78);
    ppFVar1 = tmp.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar2 = false;
    if (-1 < iVar3) {
      local_88 = InternalKey::user_key(&local_68->largest);
      iVar3 = (*(code *)(*ppFVar1)->file_size)(ppFVar1,&internal_key_local.size_,&local_88);
      bVar2 = iVar3 < 1;
    }
    if (bVar2) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 local_58,&local_68);
    }
  }
  bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     local_58);
  if (!bVar2) {
    local_90._M_current =
         (FileMetaData **)
         std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::begin
                   ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    local_58);
    iStack_98 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::end
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)local_58);
    std::
    sort<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>
              (local_90,(__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                         )iStack_98._M_current,NewestFirst);
    for (level = 0; uVar5 = (ulong)(uint)level,
        sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)local_58), uVar5 < sVar4; level = level + 1) {
      ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)local_58,(ulong)(uint)level);
      bVar2 = (*func)(arg,0,*ppFVar6);
      if (!bVar2) {
        local_a0 = 1;
        goto LAB_00160a19;
      }
    }
  }
  num_files._4_4_ = 1;
  do {
    if (6 < num_files._4_4_) {
      local_a0 = 0;
LAB_00160a19:
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 local_58);
      return;
    }
    sStack_b0 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          (this->files_ + num_files._4_4_);
    if ((sStack_b0 != 0) &&
       (f_1._4_4_ = FindFile(&this->vset_->icmp_,this->files_ + num_files._4_4_,(Slice *)&this_local
                            ), f_1._4_4_ < sStack_b0)) {
      ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this->files_ + num_files._4_4_,(ulong)f_1._4_4_);
      ppFVar1 = tmp.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c0 = *ppFVar6;
      local_d0 = InternalKey::user_key(&local_c0->smallest);
      iVar3 = (*(code *)(*ppFVar1)->file_size)(ppFVar1,&internal_key_local.size_,&local_d0);
      if ((-1 < iVar3) && (bVar2 = (*func)(arg,num_files._4_4_,local_c0), !bVar2)) {
        local_a0 = 1;
        goto LAB_00160a19;
      }
    }
    num_files._4_4_ = num_files._4_4_ + 1;
  } while( true );
}

Assistant:

void Version::ForEachOverlapping(Slice user_key, Slice internal_key, void* arg,
                                 bool (*func)(void*, int, FileMetaData*)) {
  const Comparator* ucmp = vset_->icmp_.user_comparator();

  // Search level-0 in order from newest to oldest.
  std::vector<FileMetaData*> tmp;
  tmp.reserve(files_[0].size());
  for (uint32_t i = 0; i < files_[0].size(); i++) {
    FileMetaData* f = files_[0][i];
    if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
        ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
      tmp.push_back(f);
    }
  }
  if (!tmp.empty()) {
    std::sort(tmp.begin(), tmp.end(), NewestFirst);
    for (uint32_t i = 0; i < tmp.size(); i++) {
      if (!(*func)(arg, 0, tmp[i])) {
        return;
      }
    }
  }

  // Search other levels.
  for (int level = 1; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Binary search to find earliest index whose largest key >= internal_key.
    uint32_t index = FindFile(vset_->icmp_, files_[level], internal_key);
    if (index < num_files) {
      FileMetaData* f = files_[level][index];
      if (ucmp->Compare(user_key, f->smallest.user_key()) < 0) {
        // All of "f" is past any data for user_key
      } else {
        if (!(*func)(arg, level, f)) {
          return;
        }
      }
    }
  }
}